

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *lhsValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rowVec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhsValue,bool scale)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  long lVar10;
  long lVar11;
  pointer pnVar12;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  soplex *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  undefined7 in_register_00000081;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  long in_FS_OFFSET;
  byte bVar18;
  int idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_488;
  int local_474;
  DataKey local_470;
  Item *local_468;
  undefined8 uStack_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar18 = 0;
  iVar2 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_488 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x0;
  local_474 = iVar2;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)&local_3d8,0,(type *)0x0);
  local_470 = (DataKey)((ulong)(uint)local_470.idx << 0x20);
  local_458.m_backend.data._M_elems[0] = 0;
  local_458.m_backend.data._M_elems[1] = -1;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)&local_458,lhsValue,rowVec,rhsValue,&local_3d8.up,&local_470.info);
  if ((int)CONCAT71(in_register_00000081,scale) != 0) {
    uVar7 = (*this->lp_scaler->_vptr_SPxScaler[1])
                      (this->lp_scaler,rowVec,
                       &(this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).scaleExp);
    local_488 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)CONCAT44(extraout_var,uVar7);
    pcVar17 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_468 = *(Item **)(in_FS_OFFSET + -8);
    local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.up.m_backend.prec_elem = 0x1c;
    local_3d8.up.m_backend.data._M_elems[0] = 0;
    local_3d8.up.m_backend.data._M_elems[1] = 0;
    local_3d8.up.m_backend.data._M_elems[2] = 0;
    local_3d8.up.m_backend.data._M_elems[3] = 0;
    local_3d8.up.m_backend.data._M_elems[4] = 0;
    local_3d8.up.m_backend.data._M_elems[5] = 0;
    local_3d8.up.m_backend.data._M_elems[6] = 0;
    local_3d8.up.m_backend.data._M_elems[7] = 0;
    local_3d8.up.m_backend.data._M_elems[8] = 0;
    local_3d8.up.m_backend.data._M_elems[9] = 0;
    local_3d8.up.m_backend.data._M_elems[10] = 0;
    local_3d8.up.m_backend.data._M_elems[0xb] = 0;
    local_3d8.up.m_backend.data._M_elems[0xc] = 0;
    local_3d8.up.m_backend.data._M_elems[0xd] = 0;
    local_3d8.up.m_backend.data._M_elems[0xe] = 0;
    local_3d8.up.m_backend.data._M_elems[0xf] = 0;
    local_3d8.up.m_backend.data._M_elems[0x10] = 0;
    local_3d8.up.m_backend.data._M_elems[0x11] = 0;
    local_3d8.up.m_backend.data._M_elems[0x12] = 0;
    local_3d8.up.m_backend.data._M_elems[0x13] = 0;
    local_3d8.up.m_backend.data._M_elems[0x14] = 0;
    local_3d8.up.m_backend.data._M_elems[0x15] = 0;
    local_3d8.up.m_backend.data._M_elems[0x16] = 0;
    local_3d8.up.m_backend.data._M_elems[0x17] = 0;
    local_3d8.up.m_backend.data._M_elems[0x18] = 0;
    local_3d8.up.m_backend.data._M_elems[0x19] = 0;
    local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.up.m_backend.exp = 0;
    local_3d8.up.m_backend.neg = false;
    uStack_460 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)local_468);
    if (((pcVar17->fpclass != cpp_dec_float_NaN) &&
        (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar17,(cpp_dec_float<200U,_int,_void> *)&local_3d8), iVar8 < 0)) {
      pnVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar4 + iVar2;
      psVar15 = local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_40 = pnVar4[iVar2].m_backend.exp;
      local_3c = pnVar4[iVar2].m_backend.neg;
      local_38._0_4_ = pnVar4[iVar2].m_backend.fpclass;
      local_38._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_b0,local_488,(undefined4)local_38);
      pnVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar13 = &local_3d8;
      pnVar12 = pnVar4 + iVar2;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
        pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      pnVar4[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
      pnVar4[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
      pnVar4[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
      pnVar4[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    }
    pcVar17 = &(this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
    ::soplex::infinity::__tls_init();
    local_3d8.up.m_backend.fpclass = cpp_dec_float_finite;
    local_3d8.up.m_backend.prec_elem = 0x1c;
    local_3d8.up.m_backend.data._M_elems[0] = 0;
    local_3d8.up.m_backend.data._M_elems[1] = 0;
    local_3d8.up.m_backend.data._M_elems[2] = 0;
    local_3d8.up.m_backend.data._M_elems[3] = 0;
    local_3d8.up.m_backend.data._M_elems[4] = 0;
    local_3d8.up.m_backend.data._M_elems[5] = 0;
    local_3d8.up.m_backend.data._M_elems[6] = 0;
    local_3d8.up.m_backend.data._M_elems[7] = 0;
    local_3d8.up.m_backend.data._M_elems[8] = 0;
    local_3d8.up.m_backend.data._M_elems[9] = 0;
    local_3d8.up.m_backend.data._M_elems[10] = 0;
    local_3d8.up.m_backend.data._M_elems[0xb] = 0;
    local_3d8.up.m_backend.data._M_elems[0xc] = 0;
    local_3d8.up.m_backend.data._M_elems[0xd] = 0;
    local_3d8.up.m_backend.data._M_elems[0xe] = 0;
    local_3d8.up.m_backend.data._M_elems[0xf] = 0;
    local_3d8.up.m_backend.data._M_elems[0x10] = 0;
    local_3d8.up.m_backend.data._M_elems[0x11] = 0;
    local_3d8.up.m_backend.data._M_elems[0x12] = 0;
    local_3d8.up.m_backend.data._M_elems[0x13] = 0;
    local_3d8.up.m_backend.data._M_elems[0x14] = 0;
    local_3d8.up.m_backend.data._M_elems[0x15] = 0;
    local_3d8.up.m_backend.data._M_elems[0x16] = 0;
    local_3d8.up.m_backend.data._M_elems[0x17] = 0;
    local_3d8.up.m_backend.data._M_elems[0x18] = 0;
    local_3d8.up.m_backend.data._M_elems[0x19] = 0;
    local_3d8.up.m_backend.data._M_elems._104_5_ = 0;
    local_3d8.up.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_3d8.up.m_backend.exp = 0;
    local_3d8.up.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3d8,-(double)local_468);
    if (((pcVar17->fpclass != cpp_dec_float_NaN) &&
        (local_3d8.up.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar17,(cpp_dec_float<200U,_int,_void> *)&local_3d8), 0 < iVar8)) {
      pnVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar4 + iVar2;
      psVar15 = local_130;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_c0 = pnVar4[iVar2].m_backend.exp;
      local_bc = pnVar4[iVar2].m_backend.neg;
      local_b8._0_4_ = pnVar4[iVar2].m_backend.fpclass;
      local_b8._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_3d8,local_130,local_488,(undefined4)local_b8);
      pnVar4 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar13 = &local_3d8;
      pnVar12 = pnVar4 + iVar2;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
        pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      pnVar4[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
      pnVar4[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
      pnVar4[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
      pnVar4[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    }
    pnVar4 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = pnVar4 + iVar2;
    psVar15 = local_1b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined4 *)psVar15 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
      psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
    }
    local_140 = pnVar4[iVar2].m_backend.exp;
    local_13c = pnVar4[iVar2].m_backend.neg;
    local_138._0_4_ = pnVar4[iVar2].m_backend.fpclass;
    local_138._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_3d8,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)uVar7,(undefined4)local_138);
    pnVar4 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar13 = &local_3d8;
    pnVar12 = pnVar4 + iVar2;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
      pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pnVar4[iVar2].m_backend.exp = local_3d8.up.m_backend.exp;
    pnVar4[iVar2].m_backend.neg = local_3d8.up.m_backend.neg;
    pnVar4[iVar2].m_backend.fpclass = local_3d8.up.m_backend.fpclass;
    pnVar4[iVar2].m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
    (this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[iVar2] = uVar7;
  }
  pIVar5 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[iVar2].idx;
  lVar10 = (long)pIVar5[iVar2].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  if (0 < lVar10) {
    local_468 = pIVar5 + iVar2;
    do {
      pIVar5 = local_468;
      lVar1 = lVar10 + -1;
      pNVar9 = (local_468->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar2 = pNVar9[lVar10 + -1].idx;
      if (scale) {
        pNVar14 = pNVar9 + lVar1;
        psVar15 = local_230;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(undefined4 *)psVar15 = (pNVar14->val).m_backend.data._M_elems[0];
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
        }
        local_1c0 = pNVar9[lVar1].val.m_backend.exp;
        local_1bc = pNVar9[lVar1].val.m_backend.neg;
        local_1b8._0_4_ = pNVar9[lVar1].val.m_backend.fpclass;
        local_1b8._4_4_ = pNVar9[lVar1].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)(uint)((this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).scaleExp.data[iVar2] + (int)local_488),
                   CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
        pNVar9 = (pIVar5->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pLVar13 = &local_3d8;
        pNVar14 = pNVar9 + lVar1;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pNVar14->val).m_backend.data._M_elems[0] = (pLVar13->up).m_backend.data._M_elems[0];
          pLVar13 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar13 + (ulong)bVar18 * -8 + 4);
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        pNVar9[lVar1].val.m_backend.exp = local_3d8.up.m_backend.exp;
        pNVar9[lVar1].val.m_backend.neg = local_3d8.up.m_backend.neg;
        pNVar9[lVar1].val.m_backend.fpclass = local_3d8.up.m_backend.fpclass;
        pNVar9[lVar1].val.m_backend.prec_elem = local_3d8.up.m_backend.prec_elem;
        pNVar9 = (pIVar5->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
      }
      pNVar14 = pNVar9 + lVar1;
      pnVar16 = &local_458;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pNVar14->val).m_backend.data._M_elems[0];
        pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + (ulong)bVar18 * -8 + 4);
      }
      local_458.m_backend.exp = pNVar9[lVar1].val.m_backend.exp;
      local_458.m_backend.neg = pNVar9[lVar1].val.m_backend.neg;
      local_458.m_backend.fpclass = pNVar9[lVar1].val.m_backend.fpclass;
      local_458.m_backend.prec_elem = pNVar9[lVar1].val.m_backend.prec_elem;
      if ((this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar2) {
        LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPColBase(&local_3d8,0);
        iVar8 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar8 <= iVar2) {
          iVar8 = (iVar2 - iVar8) + 1;
          do {
            local_470.info = 0;
            local_470.idx = -1;
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_470,&local_3d8);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
        if (local_3d8.vec.theelem !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_3d8.vec.theelem);
        }
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar2,1,&local_474,&local_458);
      bVar6 = 1 < lVar10;
      lVar10 = lVar1;
    } while (bVar6);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar3));
  return;
}

Assistant:

void doAddRow(const R& lhsValue, const SVectorBase<R>& rowVec, const R& rhsValue,
                 bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(lhsValue, rowVec, rhsValue);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(rowVec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      SVectorBase<R>& vec = rowVector_w(idx);

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }